

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.c
# Opt level: O2

void log_packet(LogContext *ctx,int direction,int type,char *texttype,void *data,size_t len,
               int n_blanks,logblank_t *blanks,unsigned_long *seq,uint downstream_id,
               char *additional_log_text)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  char cVar5;
  ulong uVar6;
  char cVar7;
  char *pcVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  ptrlen data_00;
  char smalldata [5];
  char dumpdata [128];
  
  if (ctx->logtype == 4) {
    if (texttype == (char *)0x0) {
      ltime();
      strftime(dumpdata,0x18,"%Y-%m-%d %H:%M:%S",(tm *)smalldata);
      pcVar8 = "Outgoing";
      if (direction == 0) {
        pcVar8 = "Incoming";
      }
      logprintf(ctx,"%s raw data at %s\r\n",pcVar8,dumpdata);
      goto LAB_00130777;
    }
  }
  else if (texttype == (char *)0x0 || ctx->logtype != 3) {
    return;
  }
  pcVar8 = "Outgoing";
  if (direction == 0) {
    pcVar8 = "Incoming";
  }
  logprintf(ctx,"%s packet ",pcVar8);
  if (seq != (unsigned_long *)0x0) {
    logprintf(ctx,"#0x%lx, ",*seq);
  }
  logprintf(ctx,"type %d / 0x%02x (%s)",(ulong)(uint)type,(ulong)(uint)type,texttype);
  if ((downstream_id != 0) &&
     (logprintf(ctx," on behalf of downstream #%u",(ulong)downstream_id),
     additional_log_text != (char *)0x0)) {
    logprintf(ctx," (%s)",additional_log_text);
  }
  logprintf(ctx,"\r\n");
LAB_00130777:
  uVar9 = (ulong)n_blanks;
  lVar10 = 0;
  uVar14 = 0;
  uVar11 = 0;
  iVar13 = 0;
LAB_0013079b:
  do {
    if (uVar14 == len) {
      if (lVar10 != 0) {
        pcVar8 = "s";
        if (lVar10 == 1) {
          pcVar8 = anon_var_dwarf_331ec + 10;
        }
        logprintf(ctx,"  (%zu byte%s omitted)\r\n",lVar10,pcVar8);
      }
      logflush(ctx);
      return;
    }
    uVar6 = uVar9;
    if (uVar9 < uVar11) {
      uVar6 = uVar11;
    }
    piVar4 = &blanks[uVar11].type;
    while( true ) {
      iVar3 = 0;
      if (uVar9 <= uVar11) break;
      if (uVar14 < (ulong)((long)piVar4[-1] + (long)((logblank_t *)(piVar4 + -2))->offset)) {
        uVar6 = uVar11;
        iVar3 = 0;
        if ((ulong)(long)((logblank_t *)(piVar4 + -2))->offset <= uVar14) {
          iVar3 = *piVar4;
        }
        break;
      }
      uVar11 = uVar11 + 1;
      piVar4 = piVar4 + 3;
    }
    if (lVar10 != 0 && iVar3 != 2) {
      pcVar8 = "s";
      if (lVar10 == 1) {
        pcVar8 = anon_var_dwarf_331ec + 10;
      }
      logprintf(ctx,"  (%zu byte%s omitted)\r\n",lVar10,pcVar8);
      lVar10 = 0;
    }
    if (lVar10 == 0 && iVar13 == 0) {
      sprintf(dumpdata,"  %08zx%*s\r\n",uVar14 & 0xfffffffffffffff0,0x43,anon_var_dwarf_331ec + 10);
    }
    if (iVar3 == 1) {
      smalldata[2] = '\0';
      smalldata[0] = 'X';
      smalldata[1] = 'X';
      cVar5 = 'X';
      cVar7 = 'X';
      uVar12 = 0x58;
LAB_001308b1:
      uVar2 = (uint)uVar14 & 0xf;
      lVar1 = (ulong)uVar2 * 3;
      dumpdata[lVar1 + 0xc] = cVar7;
      dumpdata[lVar1 + 0xd] = cVar5;
      if (0x5e < uVar12 - 0x20) {
        uVar12 = 0x2e;
      }
      dumpdata[(ulong)uVar2 + 0x3d] = (char)uVar12;
      iVar3 = uVar2 + 1;
    }
    else {
      if (iVar3 != 2) {
        uVar12 = (uint)*(byte *)((long)data + uVar14);
        sprintf(smalldata,"%02x",(ulong)*(byte *)((long)data + uVar14));
        cVar7 = smalldata[0];
        cVar5 = smalldata[1];
        goto LAB_001308b1;
      }
      lVar10 = lVar10 + 1;
      iVar3 = iVar13;
    }
    uVar14 = uVar14 + 1;
    uVar11 = uVar6;
    if ((uVar14 & 0xf) == 0) goto LAB_00130908;
    iVar13 = iVar3;
  } while (lVar10 == 0 && uVar14 != len || iVar3 == 0);
  goto LAB_00130913;
LAB_00130908:
  iVar13 = 0;
  if (iVar3 != 0) {
LAB_00130913:
    dumpdata[(long)iVar3 + 0x3f] = '\0';
    (dumpdata + (long)iVar3 + 0x3d)[0] = '\r';
    (dumpdata + (long)iVar3 + 0x3d)[1] = '\n';
    data_00 = ptrlen_from_asciz(dumpdata);
    logwrite(ctx,data_00);
    iVar13 = 0;
  }
  goto LAB_0013079b;
}

Assistant:

void log_packet(LogContext *ctx, int direction, int type,
                const char *texttype, const void *data, size_t len,
                int n_blanks, const struct logblank_t *blanks,
                const unsigned long *seq,
                unsigned downstream_id, const char *additional_log_text)
{
    char dumpdata[128], smalldata[5];
    size_t p = 0, b = 0, omitted = 0;
    int output_pos = 0; /* NZ if pending output in dumpdata */

    if (!(ctx->logtype == LGTYP_SSHRAW ||
          (ctx->logtype == LGTYP_PACKETS && texttype)))
        return;

    /* Packet header. */
    if (texttype) {
        logprintf(ctx, "%s packet ",
                  direction == PKT_INCOMING ? "Incoming" : "Outgoing");

        if (seq)
            logprintf(ctx, "#0x%lx, ", *seq);

        logprintf(ctx, "type %d / 0x%02x (%s)", type, type, texttype);

        if (downstream_id) {
            logprintf(ctx, " on behalf of downstream #%u", downstream_id);
            if (additional_log_text)
                logprintf(ctx, " (%s)", additional_log_text);
        }

        logprintf(ctx, "\r\n");
    } else {
        /*
         * Raw data is logged with a timestamp, so that it's possible
         * to determine whether a mysterious delay occurred at the
         * client or server end. (Timestamping the raw data avoids
         * cluttering the normal case of only logging decrypted SSH
         * messages, and also adds conceptual rigour in the case where
         * an SSH message arrives in several pieces.)
         */
        char buf[256];
        struct tm tm;
        tm = ltime();
        strftime(buf, 24, "%Y-%m-%d %H:%M:%S", &tm);
        logprintf(ctx, "%s raw data at %s\r\n",
                  direction == PKT_INCOMING ? "Incoming" : "Outgoing",
                  buf);
    }

    /*
     * Output a hex/ASCII dump of the packet body, blanking/omitting
     * parts as specified.
     */
    while (p < len) {
        int blktype;

        /* Move to a current entry in the blanking array. */
        while ((b < n_blanks) &&
               (p >= blanks[b].offset + blanks[b].len))
            b++;
        /* Work out what type of blanking to apply to
         * this byte. */
        blktype = PKTLOG_EMIT; /* default */
        if ((b < n_blanks) &&
            (p >= blanks[b].offset) &&
            (p < blanks[b].offset + blanks[b].len))
            blktype = blanks[b].type;

        /* If we're about to stop omitting, it's time to say how
         * much we omitted. */
        if ((blktype != PKTLOG_OMIT) && omitted) {
            logprintf(ctx, "  (%"SIZEu" byte%s omitted)\r\n",
                      omitted, (omitted==1?"":"s"));
            omitted = 0;
        }

        /* (Re-)initialise dumpdata as necessary
         * (start of row, or if we've just stopped omitting) */
        if (!output_pos && !omitted)
            sprintf(dumpdata, "  %08"SIZEx"%*s\r\n",
                    p-(p%16), 1+3*16+2+16, "");

        /* Deal with the current byte. */
        if (blktype == PKTLOG_OMIT) {
            omitted++;
        } else {
            int c;
            if (blktype == PKTLOG_BLANK) {
                c = 'X';
                sprintf(smalldata, "XX");
            } else {  /* PKTLOG_EMIT */
                c = ((const unsigned char *)data)[p];
                sprintf(smalldata, "%02x", c);
            }
            dumpdata[10+2+3*(p%16)] = smalldata[0];
            dumpdata[10+2+3*(p%16)+1] = smalldata[1];
            dumpdata[10+1+3*16+2+(p%16)] = (c >= 0x20 && c < 0x7F ? c : '.');
            output_pos = (p%16) + 1;
        }

        p++;

        /* Flush row if necessary */
        if (((p % 16) == 0) || (p == len) || omitted) {
            if (output_pos) {
                strcpy(dumpdata + 10+1+3*16+2+output_pos, "\r\n");
                logwrite(ctx, ptrlen_from_asciz(dumpdata));
                output_pos = 0;
            }
        }

    }

    /* Tidy up */
    if (omitted)
        logprintf(ctx, "  (%"SIZEu" byte%s omitted)\r\n",
                  omitted, (omitted==1?"":"s"));
    logflush(ctx);
}